

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::A_formatter<spdlog::details::scoped_padder>::format
          (A_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *__s;
  size_t wrapped_size;
  ulong uVar1;
  char *buf_ptr;
  ptrdiff_t _Num;
  scoped_padder p;
  scoped_padder sStack_48;
  
  __s = *(char **)(full_days + (long)tm_time->tm_wday * 8);
  wrapped_size = strlen(__s);
  scoped_padder::scoped_padder(&sStack_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = (dest->super_buffer<char>).size_ + wrapped_size;
  if ((dest->super_buffer<char>).capacity_ < uVar1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
  }
  if (wrapped_size != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s,wrapped_size);
  }
  (dest->super_buffer<char>).size_ = uVar1;
  scoped_padder::~scoped_padder(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{full_days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }